

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
wasm::Builder::makeFunction
          (Name name,vector<wasm::NameType,_std::allocator<wasm::NameType>_> *params,HeapType type,
          vector<wasm::NameType,_std::allocator<wasm::NameType>_> *vars,Expression *body)

{
  mapped_type mVar1;
  size_t sVar2;
  Type *pTVar3;
  iterator __position;
  char *pcVar4;
  int iVar5;
  undefined8 *__s;
  long *plVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  pointer *__ptr;
  ulong uVar9;
  _Head_base<0UL,_wasm::Function_*,_false> _Var10;
  long lVar11;
  key_type *__k;
  long lVar12;
  Type *__args;
  Type *pTVar13;
  undefined8 in_stack_00000008;
  HeapType type_local;
  undefined1 local_48 [8];
  Index index;
  _Head_base<0UL,_wasm::Function_*,_false> local_38;
  
  _Var10._M_head_impl = name.super_IString.str._M_len;
  iVar5 = ::wasm::HeapType::getKind();
  if (iVar5 != 1) {
    __assert_fail("type.isSignature()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                  ,0x40,
                  "static std::unique_ptr<Function> wasm::Builder::makeFunction(Name, std::vector<NameType> &&, HeapType, std::vector<NameType> &&, Expression *)"
                 );
  }
  __s = (undefined8 *)operator_new(0x1d8);
  memset(__s,0,0x1d8);
  ::wasm::HeapType::HeapType((HeapType *)(__s + 7),(Signature)ZEXT816(0));
  *(undefined4 *)(__s + 8) = 0;
  __s[9] = 0;
  __s[10] = 0;
  __s[0xb] = 0;
  __s[0xd] = __s + 0x13;
  __s[0xe] = 1;
  __s[0xf] = 0;
  __s[0x10] = 0;
  *(undefined4 *)(__s + 0x11) = 0x3f800000;
  __s[0x12] = 0;
  __s[0x13] = 0;
  __s[0x14] = __s + 0x1a;
  __s[0x15] = 1;
  __s[0x16] = 0;
  __s[0x17] = 0;
  *(undefined4 *)(__s + 0x18) = 0x3f800000;
  __s[0x19] = 0;
  __s[0x1a] = 0;
  __s[0x1b] = __s + 0x21;
  __s[0x1c] = 1;
  __s[0x1d] = 0;
  __s[0x1e] = 0;
  *(undefined4 *)(__s + 0x1f) = 0x3f800000;
  __s[0x20] = 0;
  __s[0x21] = 0;
  *(undefined1 *)((long)__s + 0x124) = 0;
  *(undefined1 *)((long)__s + 0x13c) = 0;
  __s[0x28] = __s + 0x2e;
  __s[0x29] = 1;
  __s[0x2a] = 0;
  __s[0x2b] = 0;
  *(undefined4 *)(__s + 0x2c) = 0x3f800000;
  __s[0x2d] = 0;
  __s[0x2e] = 0;
  __s[0x2f] = __s + 0x35;
  __s[0x30] = 1;
  __s[0x31] = 0;
  __s[0x32] = 0;
  *(undefined4 *)(__s + 0x33) = 0x3f800000;
  *(undefined8 *)((long)__s + 0x1ac) = 0;
  *(undefined8 *)((long)__s + 0x1b4) = 0;
  __s[0x34] = 0;
  __s[0x35] = 0;
  __s[0x38] = 0;
  __s[0x39] = 0;
  *(undefined2 *)(__s + 0x3a) = 0;
  ((_Var10._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len = (size_t)__s;
  *__s = name.super_IString.str._M_str;
  __s[1] = params;
  __s[7] = vars;
  __s[0xc] = in_stack_00000008;
  lVar11 = *(long *)type.id;
  local_38._M_head_impl = _Var10._M_head_impl;
  if (*(long *)(type.id + 8) != lVar11) {
    lVar12 = 0;
    uVar9 = 0;
    do {
      type_local.id = ::wasm::HeapType::getSignature();
      local_48 = (undefined1  [8])&type_local;
      _index = uVar9;
      plVar6 = (long *)::wasm::Type::Iterator::operator*((Iterator *)local_48);
      if (*plVar6 != *(long *)(lVar11 + 0x10 + lVar12)) {
        __assert_fail("func->getParams()[i] == param.type",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                      ,0x47,
                      "static std::unique_ptr<Function> wasm::Builder::makeFunction(Name, std::vector<NameType> &&, HeapType, std::vector<NameType> &&, Expression *)"
                     );
      }
      __k = (key_type *)(lVar11 + lVar12);
      sVar2 = ((_Var10._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len;
      mVar1 = *(mapped_type *)(sVar2 + 0x80);
      local_48._0_4_ = mVar1;
      pmVar7 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)(sVar2 + 0xa0),__k);
      *pmVar7 = mVar1;
      __s = (undefined8 *)
            ((_Var10._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len;
      pmVar8 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)(__s + 0xd),(key_type *)local_48);
      pcVar4 = (__k->super_IString).str._M_str;
      (pmVar8->super_IString).str._M_len = (__k->super_IString).str._M_len;
      (pmVar8->super_IString).str._M_str = pcVar4;
      uVar9 = uVar9 + 1;
      lVar11 = *(long *)type.id;
      lVar12 = lVar12 + 0x18;
    } while (uVar9 < (ulong)((*(long *)(type.id + 8) - lVar11 >> 3) * -0x5555555555555555));
  }
  pTVar3 = (Type *)(body->type).id;
  if (*(Type **)body != pTVar3) {
    __args = *(Type **)body + 2;
    do {
      __position._M_current = (Type *)__s[10];
      if (__position._M_current == (Type *)__s[0xb]) {
        std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                  ((vector<wasm::Type,std::allocator<wasm::Type>> *)(__s + 9),__position,__args);
      }
      else {
        (__position._M_current)->id = __args->id;
        __s[10] = __position._M_current + 1;
      }
      __s = (undefined8 *)
            ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len;
      mVar1 = *(mapped_type *)(__s + 0x10);
      local_48._0_4_ = mVar1;
      pmVar7 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)(__s + 0x14),(key_type *)(__args + -2));
      *pmVar7 = mVar1;
      pmVar8 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)(__s + 0xd),(key_type *)local_48);
      pcVar4 = (char *)__args[-1].id;
      (pmVar8->super_IString).str._M_len = (((key_type *)(__args + -2))->super_IString).str._M_len;
      (pmVar8->super_IString).str._M_str = pcVar4;
      pTVar13 = __args + 1;
      __args = __args + 3;
    } while (pTVar13 != pTVar3);
  }
  return (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)local_38._M_head_impl;
}

Assistant:

static std::unique_ptr<Function> makeFunction(Name name,
                                                std::vector<NameType>&& params,
                                                HeapType type,
                                                std::vector<NameType>&& vars,
                                                Expression* body = nullptr) {
    assert(type.isSignature());
    auto func = std::make_unique<Function>();
    func->name = name;
    func->type = type;
    func->body = body;
    for (size_t i = 0; i < params.size(); ++i) {
      NameType& param = params[i];
      assert(func->getParams()[i] == param.type);
      Index index = func->localNames.size();
      func->localIndices[param.name] = index;
      func->localNames[index] = param.name;
    }
    for (auto& var : vars) {
      func->vars.push_back(var.type);
      Index index = func->localNames.size();
      func->localIndices[var.name] = index;
      func->localNames[index] = var.name;
    }
    return func;
  }